

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkValidator.cpp
# Opt level: O1

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::
validateNeuralNetwork<CoreML::Specification::NeuralNetworkRegressor>
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,
          NeuralNetworkRegressor *nn)

{
  int iVar1;
  uint32_t uVar2;
  Rep *pRVar3;
  NeuralNetworkLayer *layer;
  Tensor *pTVar4;
  pointer pcVar5;
  long lVar6;
  key_type *pkVar7;
  _Base_ptr p_Var8;
  bool bVar9;
  bool bVar10;
  long lVar11;
  Type *pTVar12;
  iterator iVar13;
  uint32_t *puVar14;
  undefined8 *puVar15;
  long *plVar16;
  iterator iVar17;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *this_00;
  mapped_type *pmVar18;
  size_type *psVar19;
  ulong *puVar20;
  long lVar21;
  void **ppvVar22;
  ulong uVar23;
  string err_7;
  string err;
  Result r;
  int local_1ec;
  string local_1e8;
  ulong *local_1c8;
  long local_1c0;
  ulong local_1b8;
  undefined8 uStack_1b0;
  undefined1 local_1a8 [8];
  _Alloc_hider local_1a0;
  undefined1 local_198 [24];
  RepeatedPtrFieldBase *local_180;
  Result *local_178;
  ulong *local_170;
  long local_168;
  ulong local_160;
  long lStack_158;
  long *local_150;
  undefined8 local_148;
  long local_140;
  undefined8 uStack_138;
  ulong *local_130;
  long local_128;
  ulong local_120;
  undefined4 uStack_118;
  undefined4 uStack_114;
  ulong *local_110;
  long local_108;
  ulong local_100;
  long lStack_f8;
  size_type *local_f0;
  _Alloc_hider local_e8;
  size_type local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *local_c8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *local_b0;
  void **local_a8;
  NeuralNetworkSpecValidator *local_a0;
  ulong *local_98;
  long local_90;
  ulong local_88 [2];
  _Base_ptr local_78;
  _Base_ptr local_70;
  _Base_ptr local_68;
  long *local_60 [2];
  long local_50 [2];
  void **local_40;
  void **local_38;
  
  local_178 = __return_storage_ptr__;
  local_a0 = this;
  Result::Result((Result *)&local_f0);
  pRVar3 = (nn->layers_).super_RepeatedPtrFieldBase.rep_;
  ppvVar22 = pRVar3->elements;
  if (pRVar3 == (Rep *)0x0) {
    ppvVar22 = (void **)0x0;
  }
  lVar11 = (long)(nn->layers_).super_RepeatedPtrFieldBase.current_size_;
  if (lVar11 != 0) {
    local_40 = ppvVar22 + lVar11;
    local_b8 = &(local_178->m_message).field_2;
    local_c0 = &local_a0->ModelIOBlobNameToRank;
    local_70 = &(local_a0->ModelIOBlobNameToRank)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_c8 = &local_a0->blobNameToRank;
    local_78 = &(local_a0->blobNameToRank)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_b0 = &local_a0->blobs;
    local_68 = &(local_a0->blobs)._M_t._M_impl.super__Rb_tree_header._M_header;
    do {
      layer = (NeuralNetworkLayer *)*ppvVar22;
      bVar9 = Result::good((Result *)&local_f0);
      local_38 = ppvVar22;
      if (bVar9) {
        if (local_a0->ndArrayInterpretation == true) {
          iVar1 = (layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_;
          if (iVar1 == 0) {
LAB_0031f26c:
            iVar1 = (layer->outputtensor_).super_RepeatedPtrFieldBase.current_size_;
            if (iVar1 != 0) {
              if ((layer->output_).super_RepeatedPtrFieldBase.current_size_ != iVar1) {
                plVar16 = (long *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
                local_1c8 = &local_1b8;
                lVar11 = *plVar16;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_1c8,lVar11,plVar16[1] + lVar11);
                puVar15 = (undefined8 *)
                          std::__cxx11::string::replace((ulong)&local_1c8,0,(char *)0x0,0x3e2432);
                local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
                psVar19 = puVar15 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar15 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar19) {
                  local_1e8.field_2._M_allocated_capacity = *psVar19;
                  local_1e8.field_2._8_8_ = puVar15[3];
                }
                else {
                  local_1e8.field_2._M_allocated_capacity = *psVar19;
                  local_1e8._M_dataplus._M_p = (pointer)*puVar15;
                }
                local_1e8._M_string_length = puVar15[1];
                *puVar15 = psVar19;
                puVar15[1] = 0;
                *(undefined1 *)(puVar15 + 2) = 0;
                plVar16 = (long *)std::__cxx11::string::append((char *)&local_1e8);
                local_1a8 = (undefined1  [8])local_198;
                psVar19 = (size_type *)(plVar16 + 2);
                if ((size_type *)*plVar16 == psVar19) {
                  local_198._0_8_ = *psVar19;
                  local_198._8_8_ = plVar16[3];
                }
                else {
                  local_198._0_8_ = *psVar19;
                  local_1a8 = (undefined1  [8])*plVar16;
                }
                local_1a0._M_p = (pointer)plVar16[1];
                *plVar16 = (long)psVar19;
                plVar16[1] = 0;
                *(undefined1 *)(plVar16 + 2) = 0;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
                  operator_delete(local_1e8._M_dataplus._M_p,
                                  local_1e8.field_2._M_allocated_capacity + 1);
                }
                if (local_1c8 != &local_1b8) {
                  operator_delete(local_1c8,local_1b8 + 1);
                }
                Result::Result(local_178,INVALID_MODEL_PARAMETERS,(string *)local_1a8);
                goto LAB_00320446;
              }
              pRVar3 = (layer->outputtensor_).super_RepeatedPtrFieldBase.rep_;
              local_a8 = pRVar3->elements;
              if (pRVar3 == (Rep *)0x0) {
                local_a8 = (void **)0x0;
              }
              lVar11 = (long)(layer->outputtensor_).super_RepeatedPtrFieldBase.current_size_;
              bVar9 = lVar11 == 0;
              if (!bVar9) {
                local_180 = &(layer->output_).super_RepeatedPtrFieldBase;
                lVar21 = 0;
                local_1ec = 0;
                do {
                  pTVar4 = *(Tensor **)((long)local_a8 + lVar21);
                  validateTensorMessage((Result *)local_1a8,pTVar4,layer);
                  local_f0 = (size_type *)local_1a8;
                  std::__cxx11::string::operator=((string *)&local_e8,(string *)&local_1a0);
                  if (local_1a0._M_p != local_198 + 8) {
                    operator_delete(local_1a0._M_p,local_198._8_8_ + 1);
                  }
                  bVar10 = Result::good((Result *)&local_f0);
                  if (bVar10) {
                    pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
                              Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                                        (local_180,local_1ec);
                    iVar13 = std::
                             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                             ::find(&local_c0->_M_t,pTVar12);
                    if (iVar13._M_node != local_70) {
                      uVar2 = pTVar4->rank_;
                      pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
                                Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                                          (local_180,local_1ec);
                      puVar14 = (uint32_t *)
                                std::
                                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                ::operator[](local_c0,pTVar12);
                      if (uVar2 == *puVar14) goto LAB_0031f380;
                      plVar16 = (long *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe
                                        );
                      local_130 = &local_120;
                      lVar6 = *plVar16;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)&local_130,lVar6,plVar16[1] + lVar6);
                      puVar15 = (undefined8 *)
                                std::__cxx11::string::replace
                                          ((ulong)&local_130,0,(char *)0x0,0x3e2432);
                      local_150 = &local_140;
                      plVar16 = puVar15 + 2;
                      if ((long *)*puVar15 == plVar16) {
                        local_140 = *plVar16;
                        uStack_138 = puVar15[3];
                      }
                      else {
                        local_140 = *plVar16;
                        local_150 = (long *)*puVar15;
                      }
                      local_148 = puVar15[1];
                      *puVar15 = plVar16;
                      puVar15[1] = 0;
                      *(undefined1 *)(puVar15 + 2) = 0;
                      plVar16 = (long *)std::__cxx11::string::append((char *)&local_150);
                      local_170 = &local_160;
                      puVar20 = (ulong *)(plVar16 + 2);
                      if ((ulong *)*plVar16 == puVar20) {
                        local_160 = *puVar20;
                        lStack_158 = plVar16[3];
                      }
                      else {
                        local_160 = *puVar20;
                        local_170 = (ulong *)*plVar16;
                      }
                      local_168 = plVar16[1];
                      *plVar16 = (long)puVar20;
                      plVar16[1] = 0;
                      *(undefined1 *)(plVar16 + 2) = 0;
                      pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
                                Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                                          (local_180,local_1ec);
                      local_110 = &local_100;
                      pcVar5 = (pTVar12->_M_dataplus)._M_p;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)&local_110,pcVar5,pcVar5 + pTVar12->_M_string_length);
                      uVar23 = 0xf;
                      if (local_170 != &local_160) {
                        uVar23 = local_160;
                      }
                      if (uVar23 < (ulong)(local_108 + local_168)) {
                        uVar23 = 0xf;
                        if (local_110 != &local_100) {
                          uVar23 = local_100;
                        }
                        if (uVar23 < (ulong)(local_108 + local_168)) goto LAB_0031f697;
                        puVar15 = (undefined8 *)
                                  std::__cxx11::string::replace
                                            ((ulong)&local_110,0,(char *)0x0,(ulong)local_170);
                      }
                      else {
LAB_0031f697:
                        puVar15 = (undefined8 *)
                                  std::__cxx11::string::_M_append
                                            ((char *)&local_170,(ulong)local_110);
                      }
                      local_1c8 = &local_1b8;
                      puVar20 = puVar15 + 2;
                      if ((ulong *)*puVar15 == puVar20) {
                        local_1b8 = *puVar20;
                        uStack_1b0 = puVar15[3];
                      }
                      else {
                        local_1b8 = *puVar20;
                        local_1c8 = (ulong *)*puVar15;
                      }
                      local_1c0 = puVar15[1];
                      *puVar15 = puVar20;
                      puVar15[1] = 0;
                      *(undefined1 *)puVar20 = 0;
                      puVar15 = (undefined8 *)std::__cxx11::string::append((char *)&local_1c8);
                      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
                      psVar19 = puVar15 + 2;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)*puVar15 ==
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)psVar19) {
                        local_1e8.field_2._M_allocated_capacity = *psVar19;
                        local_1e8.field_2._8_8_ = puVar15[3];
                      }
                      else {
                        local_1e8.field_2._M_allocated_capacity = *psVar19;
                        local_1e8._M_dataplus._M_p = (pointer)*puVar15;
                      }
                      local_1e8._M_string_length = puVar15[1];
                      *puVar15 = psVar19;
                      puVar15[1] = 0;
                      *(undefined1 *)(puVar15 + 2) = 0;
                      plVar16 = (long *)std::__cxx11::string::append((char *)&local_1e8);
                      local_1a8 = (undefined1  [8])local_198;
                      psVar19 = (size_type *)(plVar16 + 2);
                      if ((size_type *)*plVar16 == psVar19) {
                        local_198._0_8_ = *psVar19;
                        local_198._8_8_ = plVar16[3];
                      }
                      else {
                        local_198._0_8_ = *psVar19;
                        local_1a8 = (undefined1  [8])*plVar16;
                      }
                      local_1a0._M_p = (pointer)plVar16[1];
                      *plVar16 = (long)psVar19;
                      plVar16[1] = 0;
                      *(undefined1 *)(plVar16 + 2) = 0;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
                        operator_delete(local_1e8._M_dataplus._M_p,
                                        local_1e8.field_2._M_allocated_capacity + 1);
                      }
                      if (local_1c8 != &local_1b8) {
                        operator_delete(local_1c8,local_1b8 + 1);
                      }
                      if (local_110 != &local_100) {
                        operator_delete(local_110,local_100 + 1);
                      }
                      if (local_170 != &local_160) {
                        operator_delete(local_170,local_160 + 1);
                      }
                      if (local_150 != &local_140) {
                        operator_delete(local_150,local_140 + 1);
                      }
                      if (local_130 != &local_120) {
                        operator_delete(local_130,local_120 + 1);
                      }
                      Result::Result(local_178,INVALID_MODEL_PARAMETERS,(string *)local_1a8);
LAB_0031f964:
                      if (local_1a8 != (undefined1  [8])local_198) {
                        operator_delete((void *)local_1a8,local_198._0_8_ + 1);
                      }
                      goto LAB_0031f980;
                    }
LAB_0031f380:
                    pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
                              Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                                        (local_180,local_1ec);
                    iVar13 = std::
                             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                             ::find(&local_c8->_M_t,pTVar12);
                    if (iVar13._M_node == local_78) {
                      uVar2 = pTVar4->rank_;
                      pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
                                Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                                          (local_180,local_1ec);
                      puVar14 = (uint32_t *)
                                std::
                                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                ::operator[](local_c8,pTVar12);
                      *puVar14 = uVar2;
                    }
                    else {
                      pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
                                Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                                          (local_180,local_1ec);
                      puVar14 = (uint32_t *)
                                std::
                                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                ::operator[](local_c8,pTVar12);
                      if (*puVar14 != pTVar4->rank_) {
                        pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
                                  Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                                            (local_180,local_1ec);
                        local_1c8 = &local_1b8;
                        pcVar5 = (pTVar12->_M_dataplus)._M_p;
                        std::__cxx11::string::_M_construct<char*>
                                  ((string *)&local_1c8,pcVar5,pcVar5 + pTVar12->_M_string_length);
                        puVar15 = (undefined8 *)
                                  std::__cxx11::string::replace
                                            ((ulong)&local_1c8,0,(char *)0x0,0x3dcecf);
                        local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
                        psVar19 = puVar15 + 2;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)*puVar15 ==
                            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)psVar19) {
                          local_1e8.field_2._M_allocated_capacity = *psVar19;
                          local_1e8.field_2._8_8_ = puVar15[3];
                        }
                        else {
                          local_1e8.field_2._M_allocated_capacity = *psVar19;
                          local_1e8._M_dataplus._M_p = (pointer)*puVar15;
                        }
                        local_1e8._M_string_length = puVar15[1];
                        *puVar15 = psVar19;
                        puVar15[1] = 0;
                        *(undefined1 *)(puVar15 + 2) = 0;
                        plVar16 = (long *)std::__cxx11::string::append((char *)&local_1e8);
                        local_1a8 = (undefined1  [8])local_198;
                        psVar19 = (size_type *)(plVar16 + 2);
                        if ((size_type *)*plVar16 == psVar19) {
                          local_198._0_8_ = *psVar19;
                          local_198._8_8_ = plVar16[3];
                        }
                        else {
                          local_198._0_8_ = *psVar19;
                          local_1a8 = (undefined1  [8])*plVar16;
                        }
                        local_1a0._M_p = (pointer)plVar16[1];
                        *plVar16 = (long)psVar19;
                        plVar16[1] = 0;
                        *(undefined1 *)(plVar16 + 2) = 0;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
                          operator_delete(local_1e8._M_dataplus._M_p,
                                          local_1e8.field_2._M_allocated_capacity + 1);
                        }
                        if (local_1c8 != &local_1b8) {
                          operator_delete(local_1c8,local_1b8 + 1);
                        }
                        Result::Result(local_178,INVALID_MODEL_PARAMETERS,(string *)local_1a8);
                        goto LAB_0031f964;
                      }
                    }
                    local_1ec = local_1ec + 1;
                    bVar10 = true;
                  }
                  else {
                    *(size_type **)local_178 = local_f0;
                    (local_178->m_message)._M_dataplus._M_p = (pointer)local_b8;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_e8._M_p == &local_d8) {
                      local_b8->_M_allocated_capacity =
                           CONCAT71(local_d8._M_allocated_capacity._1_7_,local_d8._M_local_buf[0]);
                      *(undefined8 *)((long)local_b8 + 8) = local_d8._8_8_;
                    }
                    else {
                      (local_178->m_message)._M_dataplus._M_p = local_e8._M_p;
                      (local_178->m_message).field_2._M_allocated_capacity =
                           CONCAT71(local_d8._M_allocated_capacity._1_7_,local_d8._M_local_buf[0]);
                    }
                    (local_178->m_message)._M_string_length = local_e0;
                    local_e0 = 0;
                    local_d8._M_local_buf[0] = '\0';
                    local_e8._M_p = (pointer)&local_d8;
LAB_0031f980:
                    bVar10 = false;
                  }
                  if (!bVar10) {
                    bVar10 = true;
                    goto LAB_0031fada;
                  }
                  lVar21 = lVar21 + 8;
                  bVar9 = lVar11 * 8 == lVar21;
                } while (!bVar9);
              }
              bVar10 = false;
LAB_0031fada:
              if (!bVar9) goto LAB_0031fc8b;
            }
            goto LAB_0031fae4;
          }
          if ((layer->input_).super_RepeatedPtrFieldBase.current_size_ == iVar1) {
            pRVar3 = (layer->inputtensor_).super_RepeatedPtrFieldBase.rep_;
            local_a8 = pRVar3->elements;
            if (pRVar3 == (Rep *)0x0) {
              local_a8 = (void **)0x0;
            }
            lVar11 = (long)(layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_;
            bVar9 = lVar11 == 0;
            if (!bVar9) {
              local_180 = &(layer->input_).super_RepeatedPtrFieldBase;
              lVar21 = 0;
              local_1ec = 0;
              do {
                pTVar4 = *(Tensor **)((long)local_a8 + lVar21);
                validateTensorMessage((Result *)local_1a8,pTVar4,layer);
                local_f0 = (size_type *)local_1a8;
                std::__cxx11::string::operator=((string *)&local_e8,(string *)&local_1a0);
                if (local_1a0._M_p != local_198 + 8) {
                  operator_delete(local_1a0._M_p,local_198._8_8_ + 1);
                }
                bVar10 = Result::good((Result *)&local_f0);
                if (bVar10) {
                  pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
                            Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                                      (local_180,local_1ec);
                  iVar13 = std::
                           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                           ::find(&local_c0->_M_t,pTVar12);
                  if (iVar13._M_node != local_70) {
                    uVar2 = pTVar4->rank_;
                    pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
                              Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                                        (local_180,local_1ec);
                    puVar14 = (uint32_t *)
                              std::
                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                              ::operator[](local_c0,pTVar12);
                    if (uVar2 == *puVar14) goto LAB_0031eb08;
                    plVar16 = (long *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
                    local_130 = &local_120;
                    lVar6 = *plVar16;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_130,lVar6,plVar16[1] + lVar6);
                    puVar15 = (undefined8 *)
                              std::__cxx11::string::replace
                                        ((ulong)&local_130,0,(char *)0x0,0x3e2432);
                    local_150 = &local_140;
                    plVar16 = puVar15 + 2;
                    if ((long *)*puVar15 == plVar16) {
                      local_140 = *plVar16;
                      uStack_138 = puVar15[3];
                    }
                    else {
                      local_140 = *plVar16;
                      local_150 = (long *)*puVar15;
                    }
                    local_148 = puVar15[1];
                    *puVar15 = plVar16;
                    puVar15[1] = 0;
                    *(undefined1 *)(puVar15 + 2) = 0;
                    plVar16 = (long *)std::__cxx11::string::append((char *)&local_150);
                    local_170 = &local_160;
                    puVar20 = (ulong *)(plVar16 + 2);
                    if ((ulong *)*plVar16 == puVar20) {
                      local_160 = *puVar20;
                      lStack_158 = plVar16[3];
                    }
                    else {
                      local_160 = *puVar20;
                      local_170 = (ulong *)*plVar16;
                    }
                    local_168 = plVar16[1];
                    *plVar16 = (long)puVar20;
                    plVar16[1] = 0;
                    *(undefined1 *)(plVar16 + 2) = 0;
                    pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
                              Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                                        (local_180,local_1ec);
                    local_110 = &local_100;
                    pcVar5 = (pTVar12->_M_dataplus)._M_p;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_110,pcVar5,pcVar5 + pTVar12->_M_string_length);
                    uVar23 = 0xf;
                    if (local_170 != &local_160) {
                      uVar23 = local_160;
                    }
                    if (uVar23 < (ulong)(local_108 + local_168)) {
                      uVar23 = 0xf;
                      if (local_110 != &local_100) {
                        uVar23 = local_100;
                      }
                      if (uVar23 < (ulong)(local_108 + local_168)) goto LAB_0031ee1f;
                      puVar15 = (undefined8 *)
                                std::__cxx11::string::replace
                                          ((ulong)&local_110,0,(char *)0x0,(ulong)local_170);
                    }
                    else {
LAB_0031ee1f:
                      puVar15 = (undefined8 *)
                                std::__cxx11::string::_M_append((char *)&local_170,(ulong)local_110)
                      ;
                    }
                    local_1c8 = &local_1b8;
                    puVar20 = puVar15 + 2;
                    if ((ulong *)*puVar15 == puVar20) {
                      local_1b8 = *puVar20;
                      uStack_1b0 = puVar15[3];
                    }
                    else {
                      local_1b8 = *puVar20;
                      local_1c8 = (ulong *)*puVar15;
                    }
                    local_1c0 = puVar15[1];
                    *puVar15 = puVar20;
                    puVar15[1] = 0;
                    *(undefined1 *)puVar20 = 0;
                    puVar15 = (undefined8 *)std::__cxx11::string::append((char *)&local_1c8);
                    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
                    psVar19 = puVar15 + 2;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar15 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar19) {
                      local_1e8.field_2._M_allocated_capacity = *psVar19;
                      local_1e8.field_2._8_8_ = puVar15[3];
                    }
                    else {
                      local_1e8.field_2._M_allocated_capacity = *psVar19;
                      local_1e8._M_dataplus._M_p = (pointer)*puVar15;
                    }
                    local_1e8._M_string_length = puVar15[1];
                    *puVar15 = psVar19;
                    puVar15[1] = 0;
                    *(undefined1 *)(puVar15 + 2) = 0;
                    plVar16 = (long *)std::__cxx11::string::append((char *)&local_1e8);
                    local_1a8 = (undefined1  [8])local_198;
                    psVar19 = (size_type *)(plVar16 + 2);
                    if ((size_type *)*plVar16 == psVar19) {
                      local_198._0_8_ = *psVar19;
                      local_198._8_8_ = plVar16[3];
                    }
                    else {
                      local_198._0_8_ = *psVar19;
                      local_1a8 = (undefined1  [8])*plVar16;
                    }
                    local_1a0._M_p = (pointer)plVar16[1];
                    *plVar16 = (long)psVar19;
                    plVar16[1] = 0;
                    *(undefined1 *)(plVar16 + 2) = 0;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
                      operator_delete(local_1e8._M_dataplus._M_p,
                                      local_1e8.field_2._M_allocated_capacity + 1);
                    }
                    if (local_1c8 != &local_1b8) {
                      operator_delete(local_1c8,local_1b8 + 1);
                    }
                    if (local_110 != &local_100) {
                      operator_delete(local_110,local_100 + 1);
                    }
                    if (local_170 != &local_160) {
                      operator_delete(local_170,local_160 + 1);
                    }
                    if (local_150 != &local_140) {
                      operator_delete(local_150,local_140 + 1);
                    }
                    if (local_130 != &local_120) {
                      operator_delete(local_130,local_120 + 1);
                    }
                    Result::Result(local_178,INVALID_MODEL_PARAMETERS,(string *)local_1a8);
LAB_0031f0ec:
                    if (local_1a8 != (undefined1  [8])local_198) {
                      operator_delete((void *)local_1a8,local_198._0_8_ + 1);
                    }
                    goto LAB_0031f108;
                  }
LAB_0031eb08:
                  pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
                            Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                                      (local_180,local_1ec);
                  iVar13 = std::
                           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                           ::find(&local_c8->_M_t,pTVar12);
                  if (iVar13._M_node == local_78) {
                    uVar2 = pTVar4->rank_;
                    pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
                              Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                                        (local_180,local_1ec);
                    puVar14 = (uint32_t *)
                              std::
                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                              ::operator[](local_c8,pTVar12);
                    *puVar14 = uVar2;
                  }
                  else {
                    pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
                              Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                                        (local_180,local_1ec);
                    puVar14 = (uint32_t *)
                              std::
                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                              ::operator[](local_c8,pTVar12);
                    if (*puVar14 != pTVar4->rank_) {
                      pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
                                Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                                          (local_180,local_1ec);
                      local_1c8 = &local_1b8;
                      pcVar5 = (pTVar12->_M_dataplus)._M_p;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)&local_1c8,pcVar5,pcVar5 + pTVar12->_M_string_length);
                      puVar15 = (undefined8 *)
                                std::__cxx11::string::replace
                                          ((ulong)&local_1c8,0,(char *)0x0,0x3dcecf);
                      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
                      psVar19 = puVar15 + 2;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)*puVar15 ==
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)psVar19) {
                        local_1e8.field_2._M_allocated_capacity = *psVar19;
                        local_1e8.field_2._8_8_ = puVar15[3];
                      }
                      else {
                        local_1e8.field_2._M_allocated_capacity = *psVar19;
                        local_1e8._M_dataplus._M_p = (pointer)*puVar15;
                      }
                      local_1e8._M_string_length = puVar15[1];
                      *puVar15 = psVar19;
                      puVar15[1] = 0;
                      *(undefined1 *)(puVar15 + 2) = 0;
                      plVar16 = (long *)std::__cxx11::string::append((char *)&local_1e8);
                      local_1a8 = (undefined1  [8])local_198;
                      psVar19 = (size_type *)(plVar16 + 2);
                      if ((size_type *)*plVar16 == psVar19) {
                        local_198._0_8_ = *psVar19;
                        local_198._8_8_ = plVar16[3];
                      }
                      else {
                        local_198._0_8_ = *psVar19;
                        local_1a8 = (undefined1  [8])*plVar16;
                      }
                      local_1a0._M_p = (pointer)plVar16[1];
                      *plVar16 = (long)psVar19;
                      plVar16[1] = 0;
                      *(undefined1 *)(plVar16 + 2) = 0;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
                        operator_delete(local_1e8._M_dataplus._M_p,
                                        local_1e8.field_2._M_allocated_capacity + 1);
                      }
                      if (local_1c8 != &local_1b8) {
                        operator_delete(local_1c8,local_1b8 + 1);
                      }
                      Result::Result(local_178,INVALID_MODEL_PARAMETERS,(string *)local_1a8);
                      goto LAB_0031f0ec;
                    }
                  }
                  local_1ec = local_1ec + 1;
                  bVar10 = true;
                }
                else {
                  *(size_type **)local_178 = local_f0;
                  (local_178->m_message)._M_dataplus._M_p = (pointer)local_b8;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_e8._M_p == &local_d8) {
                    local_b8->_M_allocated_capacity =
                         CONCAT71(local_d8._M_allocated_capacity._1_7_,local_d8._M_local_buf[0]);
                    *(undefined8 *)((long)local_b8 + 8) = local_d8._8_8_;
                  }
                  else {
                    (local_178->m_message)._M_dataplus._M_p = local_e8._M_p;
                    (local_178->m_message).field_2._M_allocated_capacity =
                         CONCAT71(local_d8._M_allocated_capacity._1_7_,local_d8._M_local_buf[0]);
                  }
                  (local_178->m_message)._M_string_length = local_e0;
                  local_e0 = 0;
                  local_d8._M_local_buf[0] = '\0';
                  local_e8._M_p = (pointer)&local_d8;
LAB_0031f108:
                  bVar10 = false;
                }
                if (!bVar10) {
                  bVar10 = true;
                  goto LAB_0031f262;
                }
                lVar21 = lVar21 + 8;
                bVar9 = lVar11 * 8 == lVar21;
              } while (!bVar9);
            }
            bVar10 = false;
LAB_0031f262:
            if (bVar9) goto LAB_0031f26c;
            goto LAB_0031fc8b;
          }
          plVar16 = (long *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
          local_1c8 = &local_1b8;
          lVar11 = *plVar16;
          std::__cxx11::string::_M_construct<char*>((string *)&local_1c8,lVar11,plVar16[1] + lVar11)
          ;
          puVar15 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_1c8,0,(char *)0x0,0x3e2432);
          local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
          psVar19 = puVar15 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar15 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar19) {
            local_1e8.field_2._M_allocated_capacity = *psVar19;
            local_1e8.field_2._8_8_ = puVar15[3];
          }
          else {
            local_1e8.field_2._M_allocated_capacity = *psVar19;
            local_1e8._M_dataplus._M_p = (pointer)*puVar15;
          }
          local_1e8._M_string_length = puVar15[1];
          *puVar15 = psVar19;
          puVar15[1] = 0;
          *(undefined1 *)(puVar15 + 2) = 0;
          plVar16 = (long *)std::__cxx11::string::append((char *)&local_1e8);
          local_1a8 = (undefined1  [8])local_198;
          psVar19 = (size_type *)(plVar16 + 2);
          if ((size_type *)*plVar16 == psVar19) {
            local_198._0_8_ = *psVar19;
            local_198._8_8_ = plVar16[3];
          }
          else {
            local_198._0_8_ = *psVar19;
            local_1a8 = (undefined1  [8])*plVar16;
          }
          local_1a0._M_p = (pointer)plVar16[1];
          *plVar16 = (long)psVar19;
          plVar16[1] = 0;
          *(undefined1 *)(plVar16 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
            operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
          }
          if (local_1c8 != &local_1b8) {
            operator_delete(local_1c8,local_1b8 + 1);
          }
          Result::Result(local_178,INVALID_MODEL_PARAMETERS,(string *)local_1a8);
LAB_00320446:
          if (local_1a8 != (undefined1  [8])local_198) {
            operator_delete((void *)local_1a8,local_198._0_8_ + 1);
          }
          goto LAB_0031fc86;
        }
LAB_0031fae4:
        validateLayer((Result *)local_1a8,local_a0,layer);
        local_f0 = (size_type *)local_1a8;
        std::__cxx11::string::operator=((string *)&local_e8,(string *)&local_1a0);
        if (local_1a0._M_p != local_198 + 8) {
          operator_delete(local_1a0._M_p,local_198._8_8_ + 1);
        }
        bVar9 = Result::good((Result *)&local_f0);
        if (!bVar9) goto LAB_0031fc12;
        pRVar3 = (layer->input_).super_RepeatedPtrFieldBase.rep_;
        ppvVar22 = pRVar3->elements;
        if (pRVar3 == (Rep *)0x0) {
          ppvVar22 = (void **)0x0;
        }
        lVar11 = (long)(layer->input_).super_RepeatedPtrFieldBase.current_size_;
        if (lVar11 != 0) {
          lVar21 = 0;
          do {
            pkVar7 = *(key_type **)((long)ppvVar22 + lVar21);
            iVar17 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                     ::find(&local_b0->_M_t,pkVar7);
            if (iVar17._M_node == local_68) {
              plVar16 = (long *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
              local_150 = &local_140;
              lVar11 = *plVar16;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_150,lVar11,plVar16[1] + lVar11);
              plVar16 = (long *)std::__cxx11::string::replace
                                          ((ulong)&local_150,0,(char *)0x0,0x3e2432);
              local_170 = &local_160;
              puVar20 = (ulong *)(plVar16 + 2);
              if ((ulong *)*plVar16 == puVar20) {
                local_160 = *puVar20;
                lStack_158 = plVar16[3];
              }
              else {
                local_160 = *puVar20;
                local_170 = (ulong *)*plVar16;
              }
              local_168 = plVar16[1];
              *plVar16 = (long)puVar20;
              plVar16[1] = 0;
              *(undefined1 *)(plVar16 + 2) = 0;
              puVar15 = (undefined8 *)std::__cxx11::string::append((char *)&local_170);
              local_1c8 = &local_1b8;
              puVar20 = puVar15 + 2;
              if ((ulong *)*puVar15 == puVar20) {
                local_1b8 = *puVar20;
                uStack_1b0 = puVar15[3];
              }
              else {
                local_1b8 = *puVar20;
                local_1c8 = (ulong *)*puVar15;
              }
              local_1c0 = puVar15[1];
              *puVar15 = puVar20;
              puVar15[1] = 0;
              *(undefined1 *)(puVar15 + 2) = 0;
              local_130 = &local_120;
              pcVar5 = (pkVar7->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_130,pcVar5,pcVar5 + pkVar7->_M_string_length);
              uVar23 = 0xf;
              if (local_1c8 != &local_1b8) {
                uVar23 = local_1b8;
              }
              if (uVar23 < (ulong)(local_128 + local_1c0)) {
                uVar23 = 0xf;
                if (local_130 != &local_120) {
                  uVar23 = local_120;
                }
                if (uVar23 < (ulong)(local_128 + local_1c0)) goto LAB_0031fee6;
                puVar15 = (undefined8 *)
                          std::__cxx11::string::replace
                                    ((ulong)&local_130,0,(char *)0x0,(ulong)local_1c8);
              }
              else {
LAB_0031fee6:
                puVar15 = (undefined8 *)
                          std::__cxx11::string::_M_append((char *)&local_1c8,(ulong)local_130);
              }
              local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
              psVar19 = puVar15 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar15 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar19) {
                local_1e8.field_2._M_allocated_capacity = *psVar19;
                local_1e8.field_2._8_8_ = puVar15[3];
              }
              else {
                local_1e8.field_2._M_allocated_capacity = *psVar19;
                local_1e8._M_dataplus._M_p = (pointer)*puVar15;
              }
              local_1e8._M_string_length = puVar15[1];
              *puVar15 = psVar19;
              puVar15[1] = 0;
              *(undefined1 *)psVar19 = 0;
              plVar16 = (long *)std::__cxx11::string::append((char *)&local_1e8);
              local_1a8 = (undefined1  [8])local_198;
              psVar19 = (size_type *)(plVar16 + 2);
              if ((size_type *)*plVar16 == psVar19) {
                local_198._0_8_ = *psVar19;
                local_198._8_8_ = plVar16[3];
              }
              else {
                local_198._0_8_ = *psVar19;
                local_1a8 = (undefined1  [8])*plVar16;
              }
              local_1a0._M_p = (pointer)plVar16[1];
              *plVar16 = (long)psVar19;
              plVar16[1] = 0;
              *(undefined1 *)(plVar16 + 2) = 0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
                operator_delete(local_1e8._M_dataplus._M_p,
                                local_1e8.field_2._M_allocated_capacity + 1);
              }
              if (local_130 != &local_120) {
                operator_delete(local_130,local_120 + 1);
              }
              if (local_1c8 != &local_1b8) {
                operator_delete(local_1c8,local_1b8 + 1);
              }
              if (local_170 != &local_160) {
                operator_delete(local_170,local_160 + 1);
              }
              if (local_150 != &local_140) {
                operator_delete(local_150,local_140 + 1);
              }
              Result::Result(local_178,INVALID_MODEL_PARAMETERS,(string *)local_1a8);
              goto LAB_00320446;
            }
            lVar21 = lVar21 + 8;
          } while (lVar11 * 8 != lVar21);
        }
        pRVar3 = (layer->output_).super_RepeatedPtrFieldBase.rep_;
        ppvVar22 = pRVar3->elements;
        if (pRVar3 == (Rep *)0x0) {
          ppvVar22 = (void **)0x0;
        }
        lVar11 = (long)(layer->output_).super_RepeatedPtrFieldBase.current_size_;
        bVar10 = false;
        if (lVar11 != 0) {
          lVar21 = 0;
          do {
            pkVar7 = *(key_type **)((long)ppvVar22 + lVar21);
            iVar17 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                     ::find(&local_b0->_M_t,pkVar7);
            if ((iVar17._M_node != local_68) && (layer->_oneof_case_[0] != 600)) {
              pmVar18 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                        ::operator[](local_b0,pkVar7);
              p_Var8 = (pmVar18->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
              local_1a8 = (undefined1  [8])local_198;
              lVar11 = *(long *)(p_Var8 + 1);
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_1a8,lVar11,(long)&(p_Var8[1]._M_parent)->_M_color + lVar11)
              ;
              plVar16 = (long *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
              local_60[0] = local_50;
              lVar11 = *plVar16;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_60,lVar11,plVar16[1] + lVar11);
              plVar16 = (long *)std::__cxx11::string::replace
                                          ((ulong)local_60,0,(char *)0x0,0x3e2432);
              local_110 = &local_100;
              puVar20 = (ulong *)(plVar16 + 2);
              if ((ulong *)*plVar16 == puVar20) {
                local_100 = *puVar20;
                lStack_f8 = plVar16[3];
              }
              else {
                local_100 = *puVar20;
                local_110 = (ulong *)*plVar16;
              }
              local_108 = plVar16[1];
              *plVar16 = (long)puVar20;
              plVar16[1] = 0;
              *(undefined1 *)(plVar16 + 2) = 0;
              plVar16 = (long *)std::__cxx11::string::append((char *)&local_110);
              local_130 = &local_120;
              puVar20 = (ulong *)(plVar16 + 2);
              if ((ulong *)*plVar16 == puVar20) {
                local_120 = *puVar20;
                uStack_118 = (undefined4)plVar16[3];
                uStack_114 = *(undefined4 *)((long)plVar16 + 0x1c);
              }
              else {
                local_120 = *puVar20;
                local_130 = (ulong *)*plVar16;
              }
              local_128 = plVar16[1];
              *plVar16 = (long)puVar20;
              plVar16[1] = 0;
              *(undefined1 *)(plVar16 + 2) = 0;
              local_98 = local_88;
              pcVar5 = (pkVar7->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_98,pcVar5,pcVar5 + pkVar7->_M_string_length);
              uVar23 = 0xf;
              if (local_130 != &local_120) {
                uVar23 = local_120;
              }
              if (uVar23 < (ulong)(local_90 + local_128)) {
                uVar23 = 0xf;
                if (local_98 != local_88) {
                  uVar23 = local_88[0];
                }
                if (uVar23 < (ulong)(local_90 + local_128)) goto LAB_0032017d;
                puVar15 = (undefined8 *)
                          std::__cxx11::string::replace
                                    ((ulong)&local_98,0,(char *)0x0,(ulong)local_130);
              }
              else {
LAB_0032017d:
                puVar15 = (undefined8 *)
                          std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_98);
              }
              local_150 = &local_140;
              plVar16 = puVar15 + 2;
              if ((long *)*puVar15 == plVar16) {
                local_140 = *plVar16;
                uStack_138 = puVar15[3];
              }
              else {
                local_140 = *plVar16;
                local_150 = (long *)*puVar15;
              }
              local_148 = puVar15[1];
              *puVar15 = plVar16;
              puVar15[1] = 0;
              *(undefined1 *)plVar16 = 0;
              plVar16 = (long *)std::__cxx11::string::append((char *)&local_150);
              local_170 = &local_160;
              puVar20 = (ulong *)(plVar16 + 2);
              if ((ulong *)*plVar16 == puVar20) {
                local_160 = *puVar20;
                lStack_158 = plVar16[3];
              }
              else {
                local_160 = *puVar20;
                local_170 = (ulong *)*plVar16;
              }
              local_168 = plVar16[1];
              *plVar16 = (long)puVar20;
              plVar16[1] = 0;
              *(undefined1 *)(plVar16 + 2) = 0;
              puVar15 = (undefined8 *)
                        std::__cxx11::string::_M_append((char *)&local_170,(ulong)local_1a8);
              local_1c8 = &local_1b8;
              puVar20 = puVar15 + 2;
              if ((ulong *)*puVar15 == puVar20) {
                local_1b8 = *puVar20;
                uStack_1b0 = puVar15[3];
              }
              else {
                local_1b8 = *puVar20;
                local_1c8 = (ulong *)*puVar15;
              }
              local_1c0 = puVar15[1];
              *puVar15 = puVar20;
              puVar15[1] = 0;
              *(undefined1 *)(puVar15 + 2) = 0;
              puVar15 = (undefined8 *)std::__cxx11::string::append((char *)&local_1c8);
              local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
              psVar19 = puVar15 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar15 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar19) {
                local_1e8.field_2._M_allocated_capacity = *psVar19;
                local_1e8.field_2._8_8_ = puVar15[3];
              }
              else {
                local_1e8.field_2._M_allocated_capacity = *psVar19;
                local_1e8._M_dataplus._M_p = (pointer)*puVar15;
              }
              local_1e8._M_string_length = puVar15[1];
              *puVar15 = psVar19;
              puVar15[1] = 0;
              *(undefined1 *)(puVar15 + 2) = 0;
              if (local_1c8 != &local_1b8) {
                operator_delete(local_1c8,local_1b8 + 1);
              }
              if (local_170 != &local_160) {
                operator_delete(local_170,local_160 + 1);
              }
              if (local_150 != &local_140) {
                operator_delete(local_150,local_140 + 1);
              }
              if (local_98 != local_88) {
                operator_delete(local_98,local_88[0] + 1);
              }
              if (local_130 != &local_120) {
                operator_delete(local_130,local_120 + 1);
              }
              if (local_110 != &local_100) {
                operator_delete(local_110,local_100 + 1);
              }
              if (local_60[0] != local_50) {
                operator_delete(local_60[0],local_50[0] + 1);
              }
              Result::Result(local_178,INVALID_MODEL_PARAMETERS,&local_1e8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
                operator_delete(local_1e8._M_dataplus._M_p,
                                local_1e8.field_2._M_allocated_capacity + 1);
              }
              goto LAB_00320446;
            }
            this_00 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                       *)std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                         ::operator[](local_b0,pkVar7);
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
            lVar21 = lVar21 + 8;
          } while (lVar11 * 8 != lVar21);
        }
      }
      else {
LAB_0031fc12:
        *(size_type **)local_178 = local_f0;
        (local_178->m_message)._M_dataplus._M_p = (pointer)local_b8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_p == &local_d8) {
          local_b8->_M_allocated_capacity =
               CONCAT71(local_d8._M_allocated_capacity._1_7_,local_d8._M_local_buf[0]);
          *(undefined8 *)((long)local_b8 + 8) = local_d8._8_8_;
        }
        else {
          (local_178->m_message)._M_dataplus._M_p = local_e8._M_p;
          (local_178->m_message).field_2._M_allocated_capacity =
               CONCAT71(local_d8._M_allocated_capacity._1_7_,local_d8._M_local_buf[0]);
        }
        (local_178->m_message)._M_string_length = local_e0;
        local_e0 = 0;
        local_d8._M_local_buf[0] = '\0';
        local_e8._M_p = (pointer)&local_d8;
LAB_0031fc86:
        bVar10 = true;
      }
LAB_0031fc8b:
      if (bVar10) goto LAB_00320478;
      ppvVar22 = local_38 + 1;
    } while (ppvVar22 != local_40);
  }
  Result::Result(local_178);
LAB_00320478:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_p != &local_d8) {
    operator_delete(local_e8._M_p,
                    CONCAT71(local_d8._M_allocated_capacity._1_7_,local_d8._M_local_buf[0]) + 1);
  }
  return local_178;
}

Assistant:

Result NeuralNetworkSpecValidator::validateNeuralNetwork(const T& nn) {

    Result r;

    // Loop over the layers
    // For each layer, validate the following:
    // 1. inputtensor/outputtensor message, rank compatibilty with Model input/output ranks
    // 2. Check rank consistency across the network for all blobs: ranks are not allowed to change for the same blob
    // 3. Call layer specific validation function
    // 4. check that layer's inputs are already present in "availableBlobs" set
    // 5. check that layer's outputs are NOT already present in "availableBlobs" set
    // 6. Add the layer's outputs to the "availableBlobs" set
    for (const auto& layer : nn.layers()) {

        if (!r.good()) {
            return r;
        }

        // check for inputtensor message validity
        if (ndArrayInterpretation) {
            if (layer.inputtensor_size() != 0) {
                if (layer.input_size() != layer.inputtensor_size()) {
                    std::string err = "Layer '" + std::string(layer.name()) + "''s input and inputTensors have different lengths";
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                }
                int idx = 0;
                for (const auto& tensor: layer.inputtensor()) {
                    r = validateTensorMessage(tensor, layer);
                    if (!r.good()) {
                        return r;
                    }
                    if (!(ModelIOBlobNameToRank.find(layer.input(idx)) == ModelIOBlobNameToRank.end())) {
                        if (static_cast<int>(tensor.rank()) != ModelIOBlobNameToRank[layer.input(idx)]) {
                            std::string err = "Layer '" + std::string(layer.name()) + "''s input '" + std::string(layer.input(idx)) + \
                            "' is also an input to the model. However, for this tensor the rank provided in the layer description" + \
                            " does not match the one provided in the model description";
                            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                        }
                    }
                    // verify rank consistency of intermediate blobs:
                    // if a blob is both an input and output to layers, the rank specified at both places must match
                    if (blobNameToRank.find(layer.input(idx)) == blobNameToRank.end()) {
                        blobNameToRank[layer.input(idx)] = (int)tensor.rank();
                    } else {
                        if (blobNameToRank[layer.input(idx)] != (int)tensor.rank()) {
                            std::string err = "Inconsistent rank for the blob named '" + std::string(layer.input(idx)) + "'.";
                            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                        }
                    }
                    idx++;
                }
            }
            if (layer.outputtensor_size() != 0) {
                if (layer.output_size() != layer.outputtensor_size()) {
                    std::string err = "Layer '" + std::string(layer.name()) + "''s output and \"outputTensors\" property have different lengths";
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                }
                int idx = 0;
                for (const auto& tensor: layer.outputtensor()) {
                    r = validateTensorMessage(tensor, layer);
                    if (!r.good()) {
                        return r;
                    }
                    if (!(ModelIOBlobNameToRank.find(layer.output(idx)) == ModelIOBlobNameToRank.end())) {
                        if (static_cast<int>(tensor.rank()) != ModelIOBlobNameToRank[layer.output(idx)]) {
                            std::string err = "Layer '" + std::string(layer.name()) + "''s output '" + std::string(layer.output(idx)) + \
                            "' is also an output of the model. However, for this tensor the rank provided in the layer description" + \
                            " does not match the one provided in the model description";
                            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                        }
                    }
                    // verify rank consistency of intermediate blobs:
                    // if a blob is both an input and output to layers, the rank specified at both places must match
                    if (blobNameToRank.find(layer.output(idx)) == blobNameToRank.end()) {
                        blobNameToRank[layer.output(idx)] = (int)tensor.rank();
                    } else {
                        if (blobNameToRank[layer.output(idx)] != (int)tensor.rank()) {
                            std::string err = "Inconsistent rank for the blob named '" + std::string(layer.output(idx)) + "'.";
                            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                        }
                    }
                    idx++;
                }
            }
        } // inputtensor, outputtensor validity end

        // First, we check the layer for internal correctness
        // this calls layer wise function
        r = validateLayer(layer);

        if (!r.good()) {
            return r;
        }

        // Check for topological defects: the layer's input must have been produced by a blob we have
        // already seen.
        for (const auto& input: layer.input()) {
            if (blobs.find(input) == blobs.end()) {
                std::string err = "Layer '" + std::string(layer.name()) + "' consumes an input named '"
                + std::string(input) + "' which is not present in this network.";
                return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
            }
        }

        // Check for topological defects: check that the same output isn't being produced in two different places.
        // unless its the "copy" layer
        for (const auto& output: layer.output()) {
            if (blobs.find(output) != blobs.end()) {
                if (layer.layer_case() != Specification::NeuralNetworkLayer::LayerCase::kCopy) {
                    std::string layer_name = *(blobs[output].begin());
                    std::string err = "Layer '" + std::string(layer.name()) + "' produces an output named '"
                    + std::string(output) + "' which is also an output produced by the layer '"
                    + layer_name + "'.";
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                }
            }
            blobs[output].insert(layer.name());
        }
    } // loop over layers

    return Result();
}